

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_fastcgi_module.c
# Opt level: O1

ngx_http_fastcgi_ctx_t *
ngx_http_fastcgi_split(ngx_http_request_t *r,ngx_http_fastcgi_loc_conf_t *flcf)

{
  ngx_regex_t *pnVar1;
  u_char *puVar2;
  ngx_log_t *log;
  int iVar3;
  ngx_http_fastcgi_ctx_t *pnVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 local_58 [8];
  int captures [9];
  
  pnVar4 = (ngx_http_fastcgi_ctx_t *)r->ctx[ngx_http_fastcgi_module.ctx_index];
  if (pnVar4 == (ngx_http_fastcgi_ctx_t *)0x0) {
    pnVar4 = (ngx_http_fastcgi_ctx_t *)ngx_pcalloc(r->pool,0x70);
    if (pnVar4 != (ngx_http_fastcgi_ctx_t *)0x0) {
      r->ctx[ngx_http_fastcgi_module.ctx_index] = pnVar4;
      goto LAB_00172f5e;
    }
LAB_00173033:
    pnVar4 = (ngx_http_fastcgi_ctx_t *)0x0;
  }
  else {
LAB_00172f5e:
    if ((pnVar4->script_name).len != 0) {
      return pnVar4;
    }
    pnVar1 = flcf->split_regex;
    if (pnVar1 == (ngx_regex_t *)0x0) {
      uVar5 = (undefined4)(r->uri).len;
      uVar6 = *(undefined4 *)((long)&(r->uri).len + 4);
      uVar7 = *(undefined4 *)&(r->uri).data;
      uVar8 = *(undefined4 *)((long)&(r->uri).data + 4);
    }
    else {
      iVar3 = pcre_exec(pnVar1->code,pnVar1->extra,(r->uri).data,(int)(r->uri).len,0,0,local_58,9);
      if (-1 < iVar3) {
        (pnVar4->script_name).len = (long)captures[1] - (long)captures[0];
        puVar2 = (r->uri).data;
        (pnVar4->script_name).data = puVar2 + captures[0];
        (pnVar4->path_info).len = (long)captures[3] - (long)captures[2];
        (pnVar4->path_info).data = puVar2 + captures[2];
        return pnVar4;
      }
      if (iVar3 != -1) {
        log = r->connection->log;
        if (1 < log->log_level) {
          ngx_log_error_core(2,log,0,"pcre_exec() failed: %i on \"%V\" using \"%V\"",(long)iVar3,
                             &r->uri,&flcf->split_name);
          return (ngx_http_fastcgi_ctx_t *)0x0;
        }
        goto LAB_00173033;
      }
      uVar5 = (undefined4)(r->uri).len;
      uVar6 = *(undefined4 *)((long)&(r->uri).len + 4);
      uVar7 = *(undefined4 *)&(r->uri).data;
      uVar8 = *(undefined4 *)((long)&(r->uri).data + 4);
    }
    *(undefined4 *)&(pnVar4->script_name).len = uVar5;
    *(undefined4 *)((long)&(pnVar4->script_name).len + 4) = uVar6;
    *(undefined4 *)&(pnVar4->script_name).data = uVar7;
    *(undefined4 *)((long)&(pnVar4->script_name).data + 4) = uVar8;
  }
  return pnVar4;
}

Assistant:

static ngx_http_fastcgi_ctx_t *
ngx_http_fastcgi_split(ngx_http_request_t *r, ngx_http_fastcgi_loc_conf_t *flcf)
{
    ngx_http_fastcgi_ctx_t       *f;
#if (NGX_PCRE)
    ngx_int_t                     n;
    int                           captures[(1 + 2) * 3];

    f = ngx_http_get_module_ctx(r, ngx_http_fastcgi_module);

    if (f == NULL) {
        f = ngx_pcalloc(r->pool, sizeof(ngx_http_fastcgi_ctx_t));
        if (f == NULL) {
            return NULL;
        }

        ngx_http_set_ctx(r, f, ngx_http_fastcgi_module);
    }

    if (f->script_name.len) {
        return f;
    }

    if (flcf->split_regex == NULL) {
        f->script_name = r->uri;
        return f;
    }

    n = ngx_regex_exec(flcf->split_regex, &r->uri, captures, (1 + 2) * 3);

    if (n >= 0) { /* match */
        f->script_name.len = captures[3] - captures[2];
        f->script_name.data = r->uri.data + captures[2];

        f->path_info.len = captures[5] - captures[4];
        f->path_info.data = r->uri.data + captures[4];

        return f;
    }

    if (n == NGX_REGEX_NO_MATCHED) {
        f->script_name = r->uri;
        return f;
    }

    ngx_log_error(NGX_LOG_ALERT, r->connection->log, 0,
                  ngx_regex_exec_n " failed: %i on \"%V\" using \"%V\"",
                  n, &r->uri, &flcf->split_name);
    return NULL;

#else

    f = ngx_http_get_module_ctx(r, ngx_http_fastcgi_module);

    if (f == NULL) {
        f = ngx_pcalloc(r->pool, sizeof(ngx_http_fastcgi_ctx_t));
        if (f == NULL) {
            return NULL;
        }

        ngx_http_set_ctx(r, f, ngx_http_fastcgi_module);
    }

    f->script_name = r->uri;

    return f;

#endif
}